

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

FundPsbtResponse * __thiscall
cfd::js::api::json::FundPsbtResponse::GetHexString_abi_cxx11_
          (FundPsbtResponse *this,FundPsbtResponse *obj)

{
  FundPsbtResponse *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->hex_);
  return this;
}

Assistant:

static std::string GetHexString(  // line separate
      const FundPsbtResponse& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.hex_);
  }